

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUtil.c
# Opt level: O1

void Abc_SclReadTimingConstr(Abc_Frame_t *pAbc,char *pFileName,int fVerbose)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  float fVar5;
  double dVar6;
  char Buffer [1000];
  char local_418 [1000];
  
  __stream = fopen(pFileName,"rb");
  pcVar2 = fgets(local_418,1000,__stream);
  if (pcVar2 != (char *)0x0) {
    do {
      pcVar2 = strtok(local_418," \t\r\n");
      if (pcVar2 != (char *)0x0) {
        iVar1 = strcmp(pcVar2,"set_driving_cell");
        if (iVar1 == 0) {
          pcVar2 = strtok((char *)0x0," \t\r\n");
          pcVar4 = (char *)0x0;
          if (pcVar2 != (char *)0x0) {
            sVar3 = strlen(pcVar2);
            pcVar4 = (char *)malloc(sVar3 + 1);
            strcpy(pcVar4,pcVar2);
          }
          Abc_FrameSetDrivingCell(pcVar4);
          if (fVerbose != 0) {
            pcVar2 = Abc_FrameReadDrivingCell();
            pcVar4 = "Setting driving cell to be \"%s\".\n";
            goto LAB_004789f9;
          }
        }
        else {
          iVar1 = strcmp(pcVar2,"set_load");
          if (iVar1 == 0) {
            pcVar2 = strtok((char *)0x0," \t\r\n");
            dVar6 = atof(pcVar2);
            Abc_FrameSetMaxLoad((float)dVar6);
            if (fVerbose != 0) {
              fVar5 = Abc_FrameReadMaxLoad();
              printf("Setting output load to be %f.\n",(double)fVar5);
            }
          }
          else {
            pcVar4 = "Unrecognized token \"%s\".\n";
LAB_004789f9:
            printf(pcVar4,pcVar2);
          }
        }
      }
      pcVar2 = fgets(local_418,1000,__stream);
    } while (pcVar2 != (char *)0x0);
  }
  fclose(__stream);
  return;
}

Assistant:

void Abc_SclReadTimingConstr( Abc_Frame_t * pAbc, char * pFileName, int fVerbose )
{
    char Buffer[1000], * pToken;
    FILE * pFile = fopen( pFileName, "rb" );
    while ( fgets( Buffer, 1000, pFile ) )
    {
        pToken = strtok( Buffer, " \t\r\n" );
        if ( pToken == NULL )
            continue;
        if ( !strcmp(pToken, "set_driving_cell") )
//        if ( !strcmp(pToken, "default_input_cell") )
        {
            Abc_FrameSetDrivingCell( Abc_UtilStrsav(strtok(NULL, " \t\r\n")) );
            if ( fVerbose ) 
                printf( "Setting driving cell to be \"%s\".\n", Abc_FrameReadDrivingCell() );
        }
        else if ( !strcmp(pToken, "set_load") )
//        else if ( !strcmp(pToken, "default_output_load") )
        {
            Abc_FrameSetMaxLoad( atof(strtok(NULL, " \t\r\n")) );
            if ( fVerbose ) 
                printf( "Setting output load to be %f.\n", Abc_FrameReadMaxLoad() );
        }
        else printf( "Unrecognized token \"%s\".\n", pToken );
    }
    fclose( pFile );
}